

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O0

_Bool compare_intersections(roaring_bitmap_t **rnorun,roaring_bitmap_t **rruns,size_t count)

{
  _Bool _Var1;
  roaring_bitmap_t *bitmap1;
  roaring_bitmap_t *in_RDX;
  roaring_bitmap_t *in_RSI;
  roaring_bitmap_t *in_RDI;
  size_t i;
  roaring_bitmap_t *tempandruns;
  roaring_bitmap_t *tempandnorun;
  roaring_bitmap_t *bitmap2;
  
  bitmap2 = (roaring_bitmap_t *)0x0;
  while( true ) {
    if (in_RDX <= (roaring_bitmap_t *)((long)&(bitmap2->high_low_container).size + 1U)) {
      return true;
    }
    roaring_bitmap_and((roaring_bitmap_t *)rruns,(roaring_bitmap_t *)count);
    _Var1 = is_intersection_correct((roaring_bitmap_t *)rnorun,(roaring_bitmap_t *)rruns);
    if (!_Var1) {
      printf("no run intersection incorrect\n");
      return false;
    }
    _Var1 = is_intersect_correct(in_RSI,in_RDX);
    if (!_Var1) {
      printf("no run intersect incorrect\n");
      return false;
    }
    bitmap1 = roaring_bitmap_and((roaring_bitmap_t *)rruns,(roaring_bitmap_t *)count);
    _Var1 = is_intersection_correct((roaring_bitmap_t *)rnorun,(roaring_bitmap_t *)rruns);
    if (!_Var1) {
      printf("runs intersection incorrect\n");
      return false;
    }
    _Var1 = is_intersect_correct(in_RSI,in_RDX);
    if (!_Var1) {
      printf("runs intersect incorrect\n");
      return false;
    }
    _Var1 = slow_bitmap_equals(in_RDI,in_RSI);
    if (!_Var1) {
      printf("Intersections don\'t agree! (slow) \n");
      return false;
    }
    _Var1 = roaring_bitmap_equals(in_RSI,in_RDX);
    if (!_Var1) {
      printf("Intersections don\'t agree!\n");
      printf("\n\nbitmap1:\n");
      roaring_bitmap_printf_describe(in_RDX);
      printf("\n\nbitmap2:\n");
      roaring_bitmap_printf_describe(in_RDX);
      return false;
    }
    roaring_bitmap_free((roaring_bitmap_t *)0x1033d8);
    roaring_bitmap_free((roaring_bitmap_t *)0x1033e2);
    inplace_intersection(bitmap1,bitmap2);
    _Var1 = is_intersection_correct((roaring_bitmap_t *)rnorun,(roaring_bitmap_t *)rruns);
    if (!_Var1) break;
    _Var1 = is_intersect_correct(in_RSI,in_RDX);
    if (!_Var1) {
      printf("[inplace] no run intersect incorrect\n");
      return false;
    }
    inplace_intersection(bitmap1,bitmap2);
    _Var1 = is_intersection_correct((roaring_bitmap_t *)rnorun,(roaring_bitmap_t *)rruns);
    if (!_Var1) {
      printf("[inplace] runs intersection incorrect\n");
      return false;
    }
    _Var1 = is_intersect_correct(in_RSI,in_RDX);
    if (!_Var1) {
      printf("[inplace] runs intersect incorrect\n");
      return false;
    }
    _Var1 = slow_bitmap_equals(in_RDI,in_RSI);
    if (!_Var1) {
      printf("[inplace] Intersections don\'t agree! (slow) \n");
      return false;
    }
    _Var1 = roaring_bitmap_equals(in_RSI,in_RDX);
    if (!_Var1) {
      printf("[inplace] Intersections don\'t agree!\n");
      printf("\n\nbitmap1:\n");
      roaring_bitmap_printf_describe(in_RDX);
      printf("\n\nbitmap2:\n");
      roaring_bitmap_printf_describe(in_RDX);
      return false;
    }
    roaring_bitmap_free((roaring_bitmap_t *)0x1035a9);
    roaring_bitmap_free((roaring_bitmap_t *)0x1035b3);
    bitmap2 = (roaring_bitmap_t *)((long)&(bitmap2->high_low_container).size + 1);
  }
  printf("[inplace] no run intersection incorrect\n");
  return false;
}

Assistant:

bool compare_intersections(roaring_bitmap_t **rnorun, roaring_bitmap_t **rruns,
                           size_t count) {
    roaring_bitmap_t *tempandnorun;
    roaring_bitmap_t *tempandruns;
    for (size_t i = 0; i + 1 < count; ++i) {
        tempandnorun = roaring_bitmap_and(rnorun[i], rnorun[i + 1]);
        if (!is_intersection_correct(rnorun[i], rnorun[i + 1])) {
            printf("no run intersection incorrect\n");
            return false;
        }
        if (!is_intersect_correct(rnorun[i], rnorun[i + 1])) {
            printf("no run intersect incorrect\n");
            return false;
        }
        tempandruns = roaring_bitmap_and(rruns[i], rruns[i + 1]);
        if (!is_intersection_correct(rruns[i], rruns[i + 1])) {
            printf("runs intersection incorrect\n");
            return false;
        }
        if (!is_intersect_correct(rruns[i], rruns[i + 1])) {
            printf("runs intersect incorrect\n");
            return false;
        }
        if (!slow_bitmap_equals(tempandnorun, tempandruns)) {
            printf("Intersections don't agree! (slow) \n");
            return false;
        }

        if (!roaring_bitmap_equals(tempandnorun, tempandruns)) {
            printf("Intersections don't agree!\n");
            printf("\n\nbitmap1:\n");
            roaring_bitmap_printf_describe(tempandnorun);  // debug
            printf("\n\nbitmap2:\n");
            roaring_bitmap_printf_describe(tempandruns);  // debug
            return false;
        }
        roaring_bitmap_free(tempandnorun);
        roaring_bitmap_free(tempandruns);

        tempandnorun = inplace_intersection(rnorun[i], rnorun[i + 1]);
        if (!is_intersection_correct(rnorun[i], rnorun[i + 1])) {
            printf("[inplace] no run intersection incorrect\n");
            return false;
        }
        if (!is_intersect_correct(rnorun[i], rnorun[i + 1])) {
            printf("[inplace] no run intersect incorrect\n");
            return false;
        }
        tempandruns = inplace_intersection(rruns[i], rruns[i + 1]);
        if (!is_intersection_correct(rruns[i], rruns[i + 1])) {
            printf("[inplace] runs intersection incorrect\n");
            return false;
        }
        if (!is_intersect_correct(rruns[i], rruns[i + 1])) {
            printf("[inplace] runs intersect incorrect\n");
            return false;
        }
        if (!slow_bitmap_equals(tempandnorun, tempandruns)) {
            printf("[inplace] Intersections don't agree! (slow) \n");
            return false;
        }

        if (!roaring_bitmap_equals(tempandnorun, tempandruns)) {
            printf("[inplace] Intersections don't agree!\n");
            printf("\n\nbitmap1:\n");
            roaring_bitmap_printf_describe(tempandnorun);  // debug
            printf("\n\nbitmap2:\n");
            roaring_bitmap_printf_describe(tempandruns);  // debug
            return false;
        }
        roaring_bitmap_free(tempandnorun);
        roaring_bitmap_free(tempandruns);
    }
    return true;
}